

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::SparseTextureClampLookupColorTestCase::generateExpectedResult
          (string *__return_storage_ptr__,SparseTextureClampLookupColorTestCase *this,
          string *returnType,GLint level)

{
  ulong *puVar1;
  size_type *psVar2;
  undefined8 uVar3;
  int iVar4;
  undefined8 *puVar5;
  ulong uVar6;
  ostringstream s;
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8 [2];
  ulong *local_1b8;
  long local_1b0;
  ulong local_1a8 [2];
  ulong *local_198;
  long local_190;
  ulong local_188 [12];
  ios_base local_128 [264];
  
  iVar4 = std::__cxx11::string::compare((char *)returnType);
  local_1b8 = local_1a8;
  if (iVar4 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"(","");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    std::ostream::_M_insert<double>((double)((float)level / 10.0 + 0.5));
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
    std::ios_base::~ios_base(local_128);
    uVar6 = 0xf;
    if (local_1b8 != local_1a8) {
      uVar6 = local_1a8[0];
    }
    if (uVar6 < (ulong)(local_1d0 + local_1b0)) {
      uVar6 = 0xf;
      if (local_1d8 != local_1c8) {
        uVar6 = local_1c8[0];
      }
      if (uVar6 < (ulong)(local_1d0 + local_1b0)) goto LAB_00a695d8;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_1b8);
    }
    else {
LAB_00a695d8:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_1d8);
    }
    local_1f8 = &local_1e8;
    puVar1 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar1) {
      local_1e8 = *puVar1;
      uStack_1e0 = *(undefined4 *)(puVar5 + 3);
      uStack_1dc = *(undefined4 *)((long)puVar5 + 0x1c);
    }
    else {
      local_1e8 = *puVar1;
      local_1f8 = (ulong *)*puVar5;
    }
    local_1f0 = puVar5[1];
    *puVar5 = puVar1;
    puVar5[1] = 0;
    *(undefined1 *)puVar1 = 0;
    local_198 = local_188;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,", 0, 0, 1)","");
    uVar6 = 0xf;
    if (local_1f8 != &local_1e8) {
      uVar6 = local_1e8;
    }
    if (uVar6 < (ulong)(local_190 + local_1f0)) {
      uVar6 = 0xf;
      if (local_198 != local_188) {
        uVar6 = local_188[0];
      }
      if ((ulong)(local_190 + local_1f0) <= uVar6) {
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_1f8);
        goto LAB_00a69793;
      }
    }
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_198);
    goto LAB_00a69793;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"(","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  std::ostream::operator<<(&local_198,level * 10);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  std::ios_base::~ios_base(local_128);
  uVar6 = 0xf;
  if (local_1b8 != local_1a8) {
    uVar6 = local_1a8[0];
  }
  if (uVar6 < (ulong)(local_1d0 + local_1b0)) {
    uVar6 = 0xf;
    if (local_1d8 != local_1c8) {
      uVar6 = local_1c8[0];
    }
    if (uVar6 < (ulong)(local_1d0 + local_1b0)) goto LAB_00a69510;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_1b8);
  }
  else {
LAB_00a69510:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_1d8);
  }
  local_1f8 = &local_1e8;
  puVar1 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar1) {
    local_1e8 = *puVar1;
    uStack_1e0 = *(undefined4 *)(puVar5 + 3);
    uStack_1dc = *(undefined4 *)((long)puVar5 + 0x1c);
  }
  else {
    local_1e8 = *puVar1;
    local_1f8 = (ulong *)*puVar5;
  }
  local_1f0 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_198 = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,", 0, 0, 1)","");
  uVar6 = 0xf;
  if (local_1f8 != &local_1e8) {
    uVar6 = local_1e8;
  }
  if (uVar6 < (ulong)(local_190 + local_1f0)) {
    uVar6 = 0xf;
    if (local_198 != local_188) {
      uVar6 = local_188[0];
    }
    if ((ulong)(local_190 + local_1f0) <= uVar6) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_1f8);
      goto LAB_00a69793;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_198);
LAB_00a69793:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar2 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar2) {
    uVar3 = puVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
  }
  __return_storage_ptr__->_M_string_length = puVar5[1];
  *puVar5 = psVar2;
  puVar5[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if (local_198 != local_188) {
    operator_delete(local_198,local_188[0] + 1);
  }
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,local_1e8 + 1);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SparseTextureClampLookupColorTestCase::generateExpectedResult(std::string returnType, GLint level)
{
	if (returnType == "vec4")
		return std::string("(") + de::toString(0.5f + (float)level / 10) + std::string(", 0, 0, 1)");
	else
		return std::string("(") + de::toString(level * 10) + std::string(", 0, 0, 1)");
}